

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

bool __thiscall
ViconCGStreamIO::VBuffer::Read<std::__cxx11::string>
          (VBuffer *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *o_rValues)

{
  uint uVar1;
  uint uVar2;
  pointer puVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  ulong __new_size;
  string *o_rValue;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(o_rValues);
  uVar1 = (this->m_BufferImpl).m_Offset;
  puVar3 = (this->m_BufferImpl).m_Buffer.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)uVar1 + 4 <=
      (ulong)((long)(this->m_BufferImpl).m_Buffer.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar3)) {
    uVar2 = *(uint *)(puVar3 + uVar1);
    __new_size = (ulong)uVar2;
    (this->m_BufferImpl).m_Offset = uVar1 + 4;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(o_rValues,__new_size);
    pbVar4 = (o_rValues->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    o_rValue = (string *)0x0;
    if (pbVar4 != (o_rValues->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      o_rValue = pbVar4;
    }
    if (uVar2 == 0) {
      return uVar2 == 0;
    }
    bVar5 = VBufferDetail<0>::Read(&this->m_BufferImpl,o_rValue);
    if (bVar5) {
      do {
        o_rValue = o_rValue + 1;
        __new_size = __new_size - 1;
        bVar5 = __new_size == 0;
        if (bVar5) {
          return bVar5;
        }
        bVar6 = VBufferDetail<0>::Read(&this->m_BufferImpl,o_rValue);
      } while (bVar6);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool Read( std::vector< T > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    o_rValues.resize( Size );
    return VBufferDetail< VIsPod< T >::Answer >::Read( m_BufferImpl, o_rValues.empty() ? 0 : &o_rValues[ 0 ], Size );
  }